

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
libcellml::Parser::ParserImpl::loadVariable(ParserImpl *this,VariablePtr *variable,XmlNodePtr *node)

{
  IssueImpl *pIVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  string local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  string local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  allocator<char> local_579;
  undefined1 local_578 [8];
  string description;
  IssuePtr issue_3;
  string local_538;
  string local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  string local_478;
  string local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  undefined1 local_3b8 [8];
  IssuePtr issue_2;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  byte local_2c2;
  byte local_2c1;
  undefined1 local_2c0 [6];
  bool unitsAttributePresent;
  bool nameAttributePresent;
  XmlAttributePtr attribute;
  string local_2a0;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  IssuePtr issue_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  IssuePtr issue;
  string textNode;
  undefined1 local_30 [8];
  XmlNodePtr childNode;
  XmlNodePtr *node_local;
  VariablePtr *variable_local;
  ParserImpl *this_local;
  
  childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)node;
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             node);
  XmlNode::firstChild((XmlNode *)local_30);
  while (bVar2 = std::operator!=((shared_ptr<libcellml::XmlNode> *)local_30,(nullptr_t)0x0), bVar2)
  {
    peVar5 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    bVar2 = XmlNode::isText(peVar5);
    if (bVar2) {
      peVar5 = std::
               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      XmlNode::convertToString_abi_cxx11_
                ((string *)
                 &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,peVar5);
      bVar2 = hasNonWhitespaceCharacters
                        ((string *)
                         &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (bVar2) {
        Issue::IssueImpl::create();
        peVar6 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_70);
        pIVar1 = peVar6->mPimpl;
        peVar5 = std::
                 __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)childNode.
                               super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
        XmlNode::attribute_abi_cxx11_
                  ((string *)
                   &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,peVar5,"name");
        std::operator+(&local_f0,"Variable \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
        std::operator+(&local_d0,&local_f0,"\' has an invalid non-whitespace child text element \'")
        ;
        std::operator+(&local_b0,&local_d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
        std::operator+(&local_90,&local_b0,"\'.");
        Issue::IssueImpl::setDescription(pIVar1,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string
                  ((string *)
                   &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        peVar6 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_70);
        peVar7 = std::
                 __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar6->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setVariable(peVar7->mPimpl,variable);
        peVar6 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_70);
        Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,XML_UNEXPECTED_CHARACTER);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_70);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_70);
      }
      std::__cxx11::string::~string
                ((string *)
                 &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    else {
      peVar5 = std::
               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      bVar2 = XmlNode::isComment(peVar5);
      if (!bVar2) {
        Issue::IssueImpl::create();
        if ((this->mParsing1XVersion & 1U) == 0) {
          peVar6 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_120);
          pIVar1 = peVar6->mPimpl;
          peVar5 = std::
                   __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)childNode.
                                   super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
          XmlNode::attribute_abi_cxx11_(&local_280,peVar5,"name");
          std::operator+(&local_260,"Variable \'",&local_280);
          std::operator+(&local_240,&local_260,"\' has an invalid child element \'");
          peVar5 = std::
                   __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_30);
          XmlNode::name_abi_cxx11_(&local_2a0,peVar5);
          std::operator+(&local_220,&local_240,&local_2a0);
          std::operator+(&local_200,&local_220,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&local_200);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&local_220);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::string::~string((string *)&local_280);
          peVar6 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_120);
          Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,XML_UNEXPECTED_ELEMENT);
        }
        else {
          peVar6 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_120);
          pIVar1 = peVar6->mPimpl;
          peVar5 = std::
                   __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)childNode.
                                   super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
          XmlNode::attribute_abi_cxx11_(&local_1c0,peVar5,"name");
          std::operator+(&local_1a0,"Variable \'",&local_1c0);
          std::operator+(&local_180,&local_1a0,"\' ignoring child element \'");
          peVar5 = std::
                   __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_30);
          XmlNode::name_abi_cxx11_(&local_1e0,peVar5);
          std::operator+(&local_160,&local_180,&local_1e0);
          std::operator+(&local_140,&local_160,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&local_140);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_1c0);
          peVar6 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_120);
          Issue::IssueImpl::setLevel(peVar6->mPimpl,MESSAGE);
        }
        peVar6 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_120);
        peVar7 = std::
                 __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar6->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setVariable(peVar7->mPimpl,variable);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_120);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_120);
      }
    }
    std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_30);
    XmlNode::next((XmlNode *)
                  &attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount);
    std::shared_ptr<libcellml::XmlNode>::operator=
              ((shared_ptr<libcellml::XmlNode> *)local_30,
               (shared_ptr<libcellml::XmlNode> *)
               &attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr
              ((shared_ptr<libcellml::XmlNode> *)
               &attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  XmlNode::firstAttribute((XmlNode *)local_2c0);
  local_2c1 = 0;
  local_2c2 = 0;
  do {
    bVar2 = std::operator!=((shared_ptr<libcellml::XmlAttribute> *)local_2c0,(nullptr_t)0x0);
    if (!bVar2) {
      if (((local_2c1 & 1) == 0) || ((local_2c2 & 1) == 0)) {
        Issue::IssueImpl::create();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_578,"Variable ",&local_579);
        std::allocator<char>::~allocator(&local_579);
        if ((local_2c1 & 1) == 0) {
          if ((local_2c2 & 1) == 0) {
            std::__cxx11::string::operator+=
                      ((string *)local_578,"does not specify a name attribute or a units attribute."
                      );
          }
          else {
            peVar5 = std::
                     __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)childNode.
                                     super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
            XmlNode::attribute_abi_cxx11_(&local_640,peVar5,"units");
            std::operator+(&local_620,"with units \'",&local_640);
            std::operator+(&local_600,&local_620,"\' does not specify a name attribute.");
            std::__cxx11::string::operator+=((string *)local_578,(string *)&local_600);
            std::__cxx11::string::~string((string *)&local_600);
            std::__cxx11::string::~string((string *)&local_620);
            std::__cxx11::string::~string((string *)&local_640);
          }
        }
        else {
          peVar5 = std::
                   __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)childNode.
                                   super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
          XmlNode::attribute_abi_cxx11_(&local_5e0,peVar5,"name");
          std::operator+(&local_5c0,"\'",&local_5e0);
          std::operator+(&local_5a0,&local_5c0,"\' does not specify a units attribute.");
          std::__cxx11::string::operator+=((string *)local_578,(string *)&local_5a0);
          std::__cxx11::string::~string((string *)&local_5a0);
          std::__cxx11::string::~string((string *)&local_5c0);
          std::__cxx11::string::~string((string *)&local_5e0);
        }
        peVar6 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(description.field_2._M_local_buf + 8));
        Issue::IssueImpl::setDescription(peVar6->mPimpl,(string *)local_578);
        peVar6 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(description.field_2._M_local_buf + 8));
        Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,VARIABLE_ATTRIBUTE_REQUIRED);
        peVar6 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(description.field_2._M_local_buf + 8));
        peVar7 = std::
                 __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar6->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setVariable(peVar7->mPimpl,variable);
        Logger::LoggerImpl::addIssue
                  (&this->super_LoggerImpl,(IssuePtr *)((long)&description.field_2 + 8));
        std::__cxx11::string::~string((string *)local_578);
        std::shared_ptr<libcellml::Issue>::~shared_ptr
                  ((shared_ptr<libcellml::Issue> *)((long)&description.field_2 + 8));
      }
      std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
                ((shared_ptr<libcellml::XmlAttribute> *)local_2c0);
      std::shared_ptr<libcellml::XmlNode>::~shared_ptr((shared_ptr<libcellml::XmlNode> *)local_30);
      return;
    }
    peVar3 = std::
             __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_2c0);
    bVar2 = XmlAttribute::isType(peVar3,"name","");
    if (bVar2) {
      peVar4 = std::
               __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)variable);
      peVar3 = std::
               __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_2c0);
      XmlAttribute::value_abi_cxx11_(&local_2e8,peVar3);
      NamedEntity::setName(&peVar4->super_NamedEntity,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      local_2c1 = 1;
    }
    else {
      bVar2 = isIdAttribute((XmlAttributePtr *)local_2c0,(bool)(this->mParsing1XVersion & 1));
      if (bVar2) {
        peVar4 = std::
                 __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)variable);
        peVar3 = std::
                 __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_2c0);
        XmlAttribute::value_abi_cxx11_(&local_308,peVar3);
        Entity::setId((Entity *)peVar4,&local_308);
        std::__cxx11::string::~string((string *)&local_308);
      }
      else {
        peVar3 = std::
                 __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_2c0);
        bVar2 = XmlAttribute::isType(peVar3,"units","");
        if (bVar2) {
          if ((this->mParsing1XVersion & 1U) == 0) {
            peVar4 = std::
                     __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)variable);
            peVar3 = std::
                     __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_2c0);
            XmlAttribute::value_abi_cxx11_(&local_368,peVar3);
            Variable::setUnits(peVar4,&local_368);
            std::__cxx11::string::~string((string *)&local_368);
          }
          else {
            peVar4 = std::
                     __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)variable);
            peVar3 = std::
                     __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_2c0);
            XmlAttribute::value_abi_cxx11_(&local_348,peVar3);
            convertNonSiUnits(&local_328,&local_348);
            Variable::setUnits(peVar4,&local_328);
            std::__cxx11::string::~string((string *)&local_328);
            std::__cxx11::string::~string((string *)&local_348);
          }
          local_2c2 = 1;
        }
        else {
          peVar3 = std::
                   __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_2c0);
          bVar2 = XmlAttribute::isType(peVar3,"interface","");
          if (bVar2) {
            peVar4 = std::
                     __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)variable);
            peVar3 = std::
                     __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_2c0);
            XmlAttribute::value_abi_cxx11_(&local_388,peVar3);
            Variable::setInterfaceType(peVar4,&local_388);
            std::__cxx11::string::~string((string *)&local_388);
          }
          else {
            peVar3 = std::
                     __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_2c0);
            bVar2 = XmlAttribute::isType(peVar3,"initial_value","");
            if (bVar2) {
              peVar4 = std::
                       __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)variable);
              peVar3 = std::
                       __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_2c0);
              XmlAttribute::value_abi_cxx11_
                        ((string *)
                         &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,peVar3);
              Variable::setInitialValue
                        (peVar4,(string *)
                                &issue_2.
                                 super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
              std::__cxx11::string::~string
                        ((string *)
                         &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            else {
              if ((this->mParsing1XVersion & 1U) != 0) {
                peVar3 = std::
                         __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_2c0);
                bVar2 = XmlAttribute::isType(peVar3,"public_interface","");
                if (bVar2) {
                  peVar4 = std::
                           __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)variable);
                  bVar2 = Variable::hasInterfaceType(peVar4,PRIVATE);
                  if (bVar2) {
                    peVar4 = std::
                             __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)variable);
                    Variable::setInterfaceType(peVar4,PUBLIC_AND_PRIVATE);
                  }
                  else {
                    peVar4 = std::
                             __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)variable);
                    Variable::setInterfaceType(peVar4,PUBLIC);
                  }
                  goto LAB_00337c80;
                }
              }
              if ((this->mParsing1XVersion & 1U) != 0) {
                peVar3 = std::
                         __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_2c0);
                bVar2 = XmlAttribute::isType(peVar3,"private_interface","");
                if (bVar2) {
                  peVar4 = std::
                           __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)variable);
                  bVar2 = Variable::hasInterfaceType(peVar4,PUBLIC);
                  if (bVar2) {
                    peVar4 = std::
                             __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)variable);
                    Variable::setInterfaceType(peVar4,PUBLIC_AND_PRIVATE);
                  }
                  else {
                    peVar4 = std::
                             __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)variable);
                    Variable::setInterfaceType(peVar4,PRIVATE);
                  }
                  goto LAB_00337c80;
                }
              }
              Issue::IssueImpl::create();
              if ((this->mParsing1XVersion & 1U) == 0) {
                peVar6 = std::
                         __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_3b8);
                pIVar1 = peVar6->mPimpl;
                peVar5 = std::
                         __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)childNode.
                                         super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
                XmlNode::attribute_abi_cxx11_(&local_518,peVar5,"name");
                std::operator+(&local_4f8,"Variable \'",&local_518);
                std::operator+(&local_4d8,&local_4f8,"\' has an invalid attribute \'");
                peVar3 = std::
                         __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_2c0);
                XmlAttribute::name_abi_cxx11_(&local_538,peVar3);
                std::operator+(&local_4b8,&local_4d8,&local_538);
                std::operator+(&local_498,&local_4b8,"\'.");
                Issue::IssueImpl::setDescription(pIVar1,&local_498);
                std::__cxx11::string::~string((string *)&local_498);
                std::__cxx11::string::~string((string *)&local_4b8);
                std::__cxx11::string::~string((string *)&local_538);
                std::__cxx11::string::~string((string *)&local_4d8);
                std::__cxx11::string::~string((string *)&local_4f8);
                std::__cxx11::string::~string((string *)&local_518);
                peVar6 = std::
                         __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_3b8);
                Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,VARIABLE_ATTRIBUTE_OPTIONAL);
              }
              else {
                peVar6 = std::
                         __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_3b8);
                pIVar1 = peVar6->mPimpl;
                peVar5 = std::
                         __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)childNode.
                                         super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
                XmlNode::attribute_abi_cxx11_(&local_458,peVar5,"name");
                std::operator+(&local_438,"Variable \'",&local_458);
                std::operator+(&local_418,&local_438,"\' ignoring attribute \'");
                peVar3 = std::
                         __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_2c0);
                XmlAttribute::name_abi_cxx11_(&local_478,peVar3);
                std::operator+(&local_3f8,&local_418,&local_478);
                std::operator+(&local_3d8,&local_3f8,"\'.");
                Issue::IssueImpl::setDescription(pIVar1,&local_3d8);
                std::__cxx11::string::~string((string *)&local_3d8);
                std::__cxx11::string::~string((string *)&local_3f8);
                std::__cxx11::string::~string((string *)&local_478);
                std::__cxx11::string::~string((string *)&local_418);
                std::__cxx11::string::~string((string *)&local_438);
                std::__cxx11::string::~string((string *)&local_458);
                peVar6 = std::
                         __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_3b8);
                Issue::IssueImpl::setLevel(peVar6->mPimpl,MESSAGE);
              }
              peVar6 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_3b8);
              peVar7 = std::
                       __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&peVar6->mPimpl->mItem);
              AnyCellmlElement::AnyCellmlElementImpl::setVariable(peVar7->mPimpl,variable);
              Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_3b8);
              std::shared_ptr<libcellml::Issue>::~shared_ptr
                        ((shared_ptr<libcellml::Issue> *)local_3b8);
            }
          }
        }
      }
    }
LAB_00337c80:
    std::__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_2c0);
    XmlAttribute::next((XmlAttribute *)
                       &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    std::shared_ptr<libcellml::XmlAttribute>::operator=
              ((shared_ptr<libcellml::XmlAttribute> *)local_2c0,
               (shared_ptr<libcellml::XmlAttribute> *)
               &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
              ((shared_ptr<libcellml::XmlAttribute> *)
               &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  } while( true );
}

Assistant:

void Parser::ParserImpl::loadVariable(const VariablePtr &variable, const XmlNodePtr &node)
{
    // A variable should not have any children.
    XmlNodePtr childNode = node->firstChild();
    while (childNode != nullptr) {
        if (childNode->isText()) {
            std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Variable '" + node->attribute("name") + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setVariable(variable);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            if (mParsing1XVersion) {
                issue->mPimpl->setDescription("Variable '" + node->attribute("name") + "' ignoring child element '" + childNode->name() + "'.");
                issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            } else {
                issue->mPimpl->setDescription("Variable '" + node->attribute("name") + "' has an invalid child element '" + childNode->name() + "'.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            }
            issue->mPimpl->mItem->mPimpl->setVariable(variable);
            addIssue(issue);
        }
        childNode = childNode->next();
    }
    XmlAttributePtr attribute = node->firstAttribute();
    bool nameAttributePresent = false;
    bool unitsAttributePresent = false;
    while (attribute != nullptr) {
        if (attribute->isType("name")) {
            variable->setName(attribute->value());
            nameAttributePresent = true;
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            variable->setId(attribute->value());
        } else if (attribute->isType("units")) {
            if (mParsing1XVersion) {
                variable->setUnits(convertNonSiUnits(attribute->value()));
            } else {
                variable->setUnits(attribute->value());
            }
            unitsAttributePresent = true;
        } else if (attribute->isType("interface")) {
            variable->setInterfaceType(attribute->value());
        } else if (attribute->isType("initial_value")) {
            variable->setInitialValue(attribute->value());
        } else if (mParsing1XVersion && attribute->isType("public_interface")) {
            if (variable->hasInterfaceType(Variable::InterfaceType::PRIVATE)) {
                variable->setInterfaceType(Variable::InterfaceType::PUBLIC_AND_PRIVATE);
            } else {
                variable->setInterfaceType(Variable::InterfaceType::PUBLIC);
            }
        } else if (mParsing1XVersion && attribute->isType("private_interface")) {
            if (variable->hasInterfaceType(Variable::InterfaceType::PUBLIC)) {
                variable->setInterfaceType(Variable::InterfaceType::PUBLIC_AND_PRIVATE);
            } else {
                variable->setInterfaceType(Variable::InterfaceType::PRIVATE);
            }
        } else {
            auto issue = Issue::IssueImpl::create();
            if (mParsing1XVersion) {
                issue->mPimpl->setDescription("Variable '" + node->attribute("name") + "' ignoring attribute '" + attribute->name() + "'.");
                issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            } else {
                issue->mPimpl->setDescription("Variable '" + node->attribute("name") + "' has an invalid attribute '" + attribute->name() + "'.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_ATTRIBUTE_OPTIONAL);
            }
            issue->mPimpl->mItem->mPimpl->setVariable(variable);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (!nameAttributePresent || !unitsAttributePresent) {
        auto issue = Issue::IssueImpl::create();
        std::string description = "Variable ";
        if (nameAttributePresent) {
            description += "'" + node->attribute("name") + "' does not specify a units attribute.";
        } else if (unitsAttributePresent) {
            description += "with units '" + node->attribute("units") + "' does not specify a name attribute.";
        } else {
            description += "does not specify a name attribute or a units attribute.";
        }

        issue->mPimpl->setDescription(description);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_ATTRIBUTE_REQUIRED);
        issue->mPimpl->mItem->mPimpl->setVariable(variable);
        addIssue(issue);
    }
}